

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void accum_3d(float32 ***out,float32 ***in,uint32 d1,uint32 d2,uint32 d3)

{
  float32 *pfVar1;
  float32 *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (d1 != 0) {
    uVar3 = 0;
    do {
      if (d2 != 0) {
        uVar4 = 0;
        do {
          if (d3 != 0) {
            pfVar1 = in[uVar3][uVar4];
            pfVar2 = out[uVar3][uVar4];
            uVar5 = 0;
            do {
              pfVar2[uVar5] = (float32)((float)pfVar1[uVar5] + (float)pfVar2[uVar5]);
              uVar5 = uVar5 + 1;
            } while (d3 != uVar5);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != d2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != d1);
  }
  return;
}

Assistant:

void
accum_3d(float32 ***out,
	 float32 ***in,
	 uint32 d1,
	 uint32 d2,
	 uint32 d3)
{
    uint32 i, j, k;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {
	    for (k = 0; k < d3; k++) {
		out[i][j][k] += in[i][j][k];
	    }
	}
    }
}